

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

value * __thiscall docopt::value::operator=(value *this,value *other)

{
  value *pvVar1;
  value vStack_38;
  
  value(&vStack_38,other);
  pvVar1 = operator=(this,&vStack_38);
  ~value(&vStack_38);
  return pvVar1;
}

Assistant:

inline
	value& value::operator=(value const& other) {
		// make a copy and move from it; way easier.
		return *this = value{other};
	}